

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGFreeValidState(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGValidStatePtr state)

{
  xmlRelaxNGStatesPtr pxVar1;
  xmlRelaxNGValidStatePtr state_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (state != (xmlRelaxNGValidStatePtr)0x0) {
    if ((ctxt != (xmlRelaxNGValidCtxtPtr)0x0) && (ctxt->freeState == (xmlRelaxNGStatesPtr)0x0)) {
      pxVar1 = xmlRelaxNGNewStates(ctxt,0x28);
      ctxt->freeState = pxVar1;
    }
    if ((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (ctxt->freeState == (xmlRelaxNGStatesPtr)0x0)) {
      if (state->attrs != (xmlAttrPtr *)0x0) {
        (*xmlFree)(state->attrs);
      }
      (*xmlFree)(state);
    }
    else {
      xmlRelaxNGAddStatesUniq(ctxt,ctxt->freeState,state);
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeValidState(xmlRelaxNGValidCtxtPtr ctxt,
                         xmlRelaxNGValidStatePtr state)
{
    if (state == NULL)
        return;

    if ((ctxt != NULL) && (ctxt->freeState == NULL)) {
        ctxt->freeState = xmlRelaxNGNewStates(ctxt, 40);
    }
    if ((ctxt == NULL) || (ctxt->freeState == NULL)) {
        if (state->attrs != NULL)
            xmlFree(state->attrs);
        xmlFree(state);
    } else {
        xmlRelaxNGAddStatesUniq(ctxt, ctxt->freeState, state);
    }
}